

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

void __thiscall
ProString::ProString<QStringBuilder<QStringBuilder<ProString,ProString>,char_const(&)[2]>,ProString>
          (ProString *this,
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
          *str)

{
  long lVar1;
  ProString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
  *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffffb8);
  ProString(in_RDI,(QString *)in_stack_ffffffffffffffb8);
  QString::~QString((QString *)0x226217);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProString(const QStringBuilder<A, B> &str)
        : ProString(QString(str))
    {}